

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractOutline
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii,
          int *offsets)

{
  undefined4 uVar1;
  long lVar2;
  QBrush *this_00;
  qsizetype qVar3;
  ValueExtractor *this_01;
  DeclarationData *pDVar4;
  QSize QVar5;
  ValueExtractor *in_RCX;
  undefined4 *in_RSI;
  ValueExtractor *in_RDI;
  QSize *in_R8;
  QBrush *in_R9;
  long in_FS_OFFSET;
  Declaration *decl;
  int i;
  bool hit;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  ValueExtractor *in_stack_ffffffffffffff80;
  int iVar6;
  uint in_stack_ffffffffffffffa4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  extractFont(in_stack_ffffffffffffff80);
  in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
  iVar6 = 0;
  do {
    this_00 = (QBrush *)(long)iVar6;
    qVar3 = QList<QCss::Declaration>::size(&in_RDI->declarations);
    if (qVar3 <= (long)this_00) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return (bool)((byte)(in_stack_ffffffffffffffa4 >> 0x18) & 1);
    }
    this_01 = (ValueExtractor *)
              QList<QCss::Declaration>::at
                        (&in_stack_ffffffffffffff80->declarations,
                         CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    pDVar4 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa30528
                       );
    in_stack_ffffffffffffff80 = (ValueExtractor *)(ulong)(pDVar4->propertyId - Outline);
    switch(in_stack_ffffffffffffff80) {
    case (ValueExtractor *)0x0:
      borderValue(in_RCX,(Declaration *)in_R8,(int *)in_R9,
                  (BorderStyle *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),(QBrush *)this_01);
      uVar1 = in_RSI[3];
      in_RSI[2] = uVar1;
      in_RSI[1] = uVar1;
      *in_RSI = uVar1;
      uVar1 = *(undefined4 *)((long)&(in_RCX->declarations).d.ptr + 4);
      *(undefined4 *)&(in_RCX->declarations).d.ptr = uVar1;
      *(undefined4 *)((long)&(in_RCX->declarations).d.d + 4) = uVar1;
      *(undefined4 *)&(in_RCX->declarations).d.d = uVar1;
      QBrush::operator=(this_00,(QBrush *)in_stack_ffffffffffffff80);
      QBrush::operator=(this_00,(QBrush *)in_stack_ffffffffffffff80);
      QBrush::operator=(this_00,(QBrush *)in_stack_ffffffffffffff80);
      break;
    case (ValueExtractor *)0x1:
      lengthValues(this_01,(Declaration *)in_RDI,(int *)this_00);
      break;
    case (ValueExtractor *)0x2:
      lengthValues(this_01,(Declaration *)in_RDI,(int *)this_00);
      break;
    case (ValueExtractor *)0x3:
      Declaration::brushValues
                ((Declaration *)in_R8,in_R9,(QPalette *)CONCAT44(in_stack_ffffffffffffffa4,iVar6));
      break;
    case (ValueExtractor *)0x4:
      Declaration::styleValues((Declaration *)this_01,(BorderStyle *)in_RDI);
      break;
    case (ValueExtractor *)0x5:
      sizeValues(in_RDI,(Declaration *)this_00,(QSize *)in_stack_ffffffffffffff80);
      break;
    case (ValueExtractor *)0x6:
      QVar5 = sizeValue((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),
                        (Declaration *)this_01);
      *in_R8 = QVar5;
      break;
    case (ValueExtractor *)0x7:
      QVar5 = sizeValue((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),
                        (Declaration *)this_01);
      in_R8[1] = QVar5;
      break;
    case (ValueExtractor *)0x8:
      QVar5 = sizeValue((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),
                        (Declaration *)this_01);
      in_R8[2] = QVar5;
      break;
    case (ValueExtractor *)0x9:
      QVar5 = sizeValue((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),
                        (Declaration *)this_01);
      in_R8[3] = QVar5;
      break;
    default:
      goto switchD_00a30551_default;
    }
    in_stack_ffffffffffffffa4 = CONCAT13(1,(int3)in_stack_ffffffffffffffa4);
switchD_00a30551_default:
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractOutline(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii, int *offsets)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case OutlineWidth: lengthValues(decl, borders); break;
        case OutlineColor: decl.brushValues(colors, pal); break;
        case OutlineStyle:  decl.styleValues(styles); break;

        case OutlineTopLeftRadius: radii[0] = sizeValue(decl); break;
        case OutlineTopRightRadius: radii[1] = sizeValue(decl); break;
        case OutlineBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case OutlineBottomRightRadius: radii[3] = sizeValue(decl); break;
        case OutlineRadius: sizeValues(decl, radii); break;
        case OutlineOffset: lengthValues(decl, offsets); break;

        case Outline:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}